

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

int encodeutf8(uchar *dstbuf,int dstlen,uchar *srcbuf,int srclen,int *carry)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = (int)dstbuf;
  iVar2 = (int)srcbuf;
  if (0 < dstlen && 0 < srclen) {
    pbVar5 = dstbuf + dstlen;
    pbVar1 = srcbuf + srclen;
    do {
      uVar7 = cube2unichars[*srcbuf];
      if ((int)uVar7 < 0x80) {
        if (pbVar5 <= dstbuf) break;
        pbVar4 = srcbuf + ((long)pbVar5 - (long)dstbuf);
        if (pbVar1 < srcbuf + ((long)pbVar5 - (long)dstbuf)) {
          pbVar4 = pbVar1;
        }
        do {
          srcbuf = srcbuf + 1;
          *dstbuf = (byte)uVar7;
          dstbuf = dstbuf + 1;
          if (pbVar4 <= srcbuf) goto LAB_00152df1;
          uVar7 = cube2unichars[*srcbuf];
        } while ((int)uVar7 < 0x80);
      }
      if (uVar7 < 0x800) {
        if (pbVar5 < dstbuf + 2) break;
        bVar3 = (byte)(uVar7 >> 6) | 0xc0;
      }
      else {
        if (uVar7 < 0x10000) {
          if (pbVar5 < dstbuf + 3) break;
          *dstbuf = (byte)(uVar7 >> 0xc) | 0xe0;
          dstbuf = dstbuf + 1;
        }
        else {
          if (uVar7 < 0x200000) {
            if (pbVar5 < dstbuf + 4) break;
            bVar3 = (byte)(uVar7 >> 0x12) | 0xf0;
          }
          else {
            bVar3 = (byte)(uVar7 >> 0x18);
            if (uVar7 < 0x4000000) {
              if (pbVar5 < dstbuf + 5) break;
              *dstbuf = bVar3 | 0xf8;
              dstbuf = dstbuf + 1;
            }
            else {
              if (pbVar5 < dstbuf + 6) break;
              *dstbuf = bVar3 >> 6 | 0xfc;
              dstbuf[1] = bVar3 & 0x3f | 0x80;
              dstbuf = dstbuf + 2;
            }
            bVar3 = (byte)(uVar7 >> 0x12) & 0x3f | 0x80;
          }
          *dstbuf = bVar3;
          dstbuf[1] = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
          dstbuf = dstbuf + 2;
        }
        bVar3 = (byte)(uVar7 >> 6) & 0x3f | 0x80;
      }
      *dstbuf = bVar3;
      dstbuf[1] = (byte)uVar7 & 0x3f | 0x80;
      dstbuf = dstbuf + 2;
      srcbuf = srcbuf + 1;
    } while (srcbuf < pbVar1);
  }
LAB_00152df1:
  if (carry != (int *)0x0) {
    *carry = *carry + ((int)srcbuf - iVar2);
  }
  return (int)dstbuf - iVar6;
}

Assistant:

int encodeutf8(uchar *dstbuf, int dstlen, const uchar *srcbuf, int srclen, int *carry)
{
    uchar *dst = dstbuf, *dstend = &dstbuf[dstlen];
    const uchar *src = srcbuf, *srcend = &srcbuf[srclen];
    if(src < srcend && dst < dstend) do
    {
        int uni = cube2uni(*src);
        if(uni <= 0x7F)
        {
            if(dst >= dstend) goto done;
            const uchar *end = min(srcend, &src[dstend-dst]);
            do
            {
                *dst++ = uni;
                if(++src >= end) goto done;
                uni = cube2uni(*src);
            }
            while(uni <= 0x7F);
        }
        if(uni <= 0x7FF) { if(dst + 2 > dstend) goto done; *dst++ = 0xC0 | (uni>>6); goto uni2; }
        else if(uni <= 0xFFFF) { if(dst + 3 > dstend) goto done; *dst++ = 0xE0 | (uni>>12); goto uni3; }
        else if(uni <= 0x1FFFFF) { if(dst + 4 > dstend) goto done; *dst++ = 0xF0 | (uni>>18); goto uni4; }
        else if(uni <= 0x3FFFFFF) { if(dst + 5 > dstend) goto done; *dst++ = 0xF8 | (uni>>24); goto uni5; }
        else if(uni <= 0x7FFFFFFF) { if(dst + 6 > dstend) goto done; *dst++ = 0xFC | (uni>>30); goto uni6; }
        else goto uni1;
    uni6: *dst++ = 0x80 | ((uni>>24)&0x3F);
    uni5: *dst++ = 0x80 | ((uni>>18)&0x3F);
    uni4: *dst++ = 0x80 | ((uni>>12)&0x3F);
    uni3: *dst++ = 0x80 | ((uni>>6)&0x3F);
    uni2: *dst++ = 0x80 | (uni&0x3F);
    uni1:;
    }
    while(++src < srcend);

done:
    if(carry) *carry += src - srcbuf;
    return dst - dstbuf;
}